

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O1

int __thiscall
unodb::detail::
basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::init(basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
       *this,EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  ulong uVar2;
  uintptr_t uVar3;
  uintptr_t uVar4;
  uintptr_t uVar5;
  uintptr_t uVar6;
  uintptr_t uVar7;
  uintptr_t uVar8;
  uintptr_t uVar9;
  uintptr_t uVar10;
  uintptr_t uVar11;
  uintptr_t uVar12;
  uintptr_t uVar13;
  uintptr_t uVar14;
  uintptr_t uVar15;
  uintptr_t uVar16;
  uintptr_t uVar17;
  int extraout_EAX;
  long in_RCX;
  long lVar18;
  void *in_RDX;
  uint in_R8D;
  
  uVar2 = *(ulong *)(in_RCX + 8);
  *(undefined8 *)(in_RCX + 8) = 0;
  lVar18 = 0;
  do {
    (this->child_indexes)._M_elems[*(byte *)((long)in_RDX + lVar18 + 0x10)].value = (uchar)lVar18;
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x10);
  uVar3 = *(uintptr_t *)((long)in_RDX + 0x20);
  uVar4 = *(uintptr_t *)((long)in_RDX + 0x28);
  uVar5 = *(uintptr_t *)((long)in_RDX + 0x30);
  uVar6 = *(uintptr_t *)((long)in_RDX + 0x38);
  uVar7 = *(uintptr_t *)((long)in_RDX + 0x40);
  uVar8 = *(uintptr_t *)((long)in_RDX + 0x48);
  uVar9 = *(uintptr_t *)((long)in_RDX + 0x50);
  uVar10 = *(uintptr_t *)((long)in_RDX + 0x58);
  uVar11 = *(uintptr_t *)((long)in_RDX + 0x60);
  uVar12 = *(uintptr_t *)((long)in_RDX + 0x68);
  uVar13 = *(uintptr_t *)((long)in_RDX + 0x70);
  uVar14 = *(uintptr_t *)((long)in_RDX + 0x78);
  uVar15 = *(uintptr_t *)((long)in_RDX + 0x88);
  uVar16 = *(uintptr_t *)((long)in_RDX + 0x90);
  uVar17 = *(uintptr_t *)((long)in_RDX + 0x98);
  (this->children).pointer_array._M_elems[0xc].value.tagged_ptr =
       *(uintptr_t *)((long)in_RDX + 0x80);
  (this->children).pointer_array._M_elems[0xd].value.tagged_ptr = uVar15;
  (this->children).pointer_array._M_elems[0xe].value.tagged_ptr = uVar16;
  (this->children).pointer_array._M_elems[0xf].value.tagged_ptr = uVar17;
  (this->children).pointer_array._M_elems[8].value.tagged_ptr = uVar11;
  (this->children).pointer_array._M_elems[9].value.tagged_ptr = uVar12;
  (this->children).pointer_array._M_elems[10].value.tagged_ptr = uVar13;
  (this->children).pointer_array._M_elems[0xb].value.tagged_ptr = uVar14;
  (this->children).pointer_array._M_elems[4].value.tagged_ptr = uVar7;
  (this->children).pointer_array._M_elems[5].value.tagged_ptr = uVar8;
  (this->children).pointer_array._M_elems[6].value.tagged_ptr = uVar9;
  (this->children).pointer_array._M_elems[7].value.tagged_ptr = uVar10;
  (this->children).pointer_array._M_elems[0].value.tagged_ptr = uVar3;
  (this->children).pointer_array._M_elems[1].value.tagged_ptr = uVar4;
  (this->children).pointer_array._M_elems[2].value.tagged_ptr = uVar5;
  (this->children).pointer_array._M_elems[3].value.tagged_ptr = uVar6;
  bVar1 = *(byte *)(uVar2 + 8 + (ulong)in_R8D);
  if ((this->child_indexes)._M_elems[bVar1].value == 0xff) {
    (this->child_indexes)._M_elems[bVar1].value = '\x10';
    if ((uVar2 & 7) == 0) {
      (this->children).pointer_vector[4][0] = uVar2;
      bVar1 = this->field_0x8;
      if ((ulong)bVar1 < 0x30) {
        memset((void *)((long)&this->children + (ulong)bVar1 * 8),0,
               (ulong)(byte)(0x2f - bVar1) * 8 + 8);
      }
      free(in_RDX);
      db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
      ::
      decrement_inode_count<unodb::detail::inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
                ((db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                  *)ctx);
      return extraout_EAX;
    }
    __assert_fail("(result & ptr_bit_mask) == uintptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                  ,0x182,
                  "static std::uintptr_t unodb::detail::basic_node_ptr<unodb::detail::node_header>::tag_ptr(const Header *, unodb::node_type) [Header = unodb::detail::node_header]"
                 );
  }
  __assert_fail("child_indexes[key_byte] == empty_child",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                ,0x86e,
                "void unodb::detail::basic_inode_48<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::init(db_type &, inode16_type &__restrict, db_leaf_unique_ptr, tree_depth_type) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
               );
}

Assistant:

constexpr void init(db_type &db_instance,
                      inode16_type &__restrict source_node,
                      db_leaf_unique_ptr child,
                      tree_depth_type depth) noexcept {
    const auto reclaim_source_node{
        ArtPolicy::template make_db_inode_reclaimable_ptr<inode16_type>(
            &source_node, db_instance)};
    auto *const __restrict child_ptr = child.release();

    // TODO(laurynas): consider AVX512 scatter?
    std::uint8_t i = 0;
    for (; i < inode16_type::capacity; ++i) {
      const auto existing_key_byte = source_node.keys.byte_array[i].load();
      child_indexes[static_cast<std::uint8_t>(existing_key_byte)] = i;
    }
    for (i = 0; i < inode16_type::capacity; ++i) {
      children.pointer_array[i] = source_node.children[i];
    }

    const auto key_byte =
        static_cast<std::uint8_t>(child_ptr->get_key_view()[depth]);

    UNODB_DETAIL_ASSERT(child_indexes[key_byte] == empty_child);
    UNODB_DETAIL_ASSUME(i == inode16_type::capacity);

    child_indexes[key_byte] = i;
    children.pointer_array[i] = node_ptr{child_ptr, node_type::LEAF};
    for (i = this->children_count; i < basic_inode_48::capacity; i++) {
      children.pointer_array[i] = node_ptr{nullptr};
    }
  }